

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

void polymul_internal::taylor_inplace_multiplier<double,_1,_8,_10,_0>::mul(double *p1,double *p2)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = *p2 * p1[8];
  p1[8] = dVar4;
  pdVar2 = p1;
  lVar3 = 8;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[8] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[7];
  p1[7] = dVar4;
  pdVar2 = p1;
  lVar3 = 7;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[7] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[6];
  p1[6] = dVar4;
  pdVar2 = p1;
  lVar3 = 6;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[6] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[5];
  p1[5] = dVar4;
  pdVar2 = p1;
  lVar3 = 5;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[5] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[4];
  p1[4] = dVar4;
  pdVar2 = p1;
  lVar3 = 4;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[4] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[3];
  p1[3] = dVar4;
  pdVar2 = p1;
  lVar3 = 3;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[3] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2 * p1[2];
  p1[2] = dVar4;
  pdVar2 = p1;
  lVar3 = 2;
  while (lVar3 != 0) {
    dVar4 = dVar4 + *pdVar2 * p2[lVar3];
    p1[2] = dVar4;
    pdVar2 = pdVar2 + 1;
    lVar3 = lVar3 + -1;
  }
  dVar4 = *p2;
  dVar1 = p1[1];
  p1[1] = dVar4 * dVar1;
  p1[1] = p2[1] * *p1 + dVar4 * dVar1;
  *p1 = *p1 * *p2;
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    p1[Ndeg] *= p2[0];
    if (Ndeg <= Ndeg2) {
      for (int i = 0; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    } else {
      for (int i = Ndeg - Ndeg2; i < Ndeg; i++)
        p1[Ndeg] += p1[i] * p2[Ndeg - i];
    }
    taylor_inplace_multiplier<numtype, 1, Ndeg - 1, Ndeg2, 0>::mul(p1, p2);
  }